

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosComm.cpp
# Opt level: O0

string * __thiscall
adios2::helper::Comm::BroadcastFile(Comm *this,string *fileName,string *hint,int rankSource)

{
  int iVar1;
  string *in_RCX;
  string *in_RDI;
  int in_R8D;
  int rank;
  string *fileContents;
  string *in_stack_000003e0;
  string *in_stack_000003e8;
  string local_a0 [48];
  string local_70 [32];
  string local_50 [12];
  int in_stack_ffffffffffffffbc;
  string *in_stack_ffffffffffffffc0;
  Comm *in_stack_ffffffffffffffc8;
  
  iVar1 = Rank((Comm *)0x97ef63);
  std::__cxx11::string::string((string *)in_RDI);
  if (iVar1 == in_R8D) {
    std::__cxx11::string::string(local_70,in_RCX);
    FileToString(in_stack_000003e8,in_stack_000003e0);
    std::__cxx11::string::operator=((string *)in_RDI,local_50);
    std::__cxx11::string::~string(local_50);
    std::__cxx11::string::~string(local_70);
  }
  BroadcastValue<std::__cxx11::string>
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  std::__cxx11::string::operator=((string *)in_RDI,local_a0);
  std::__cxx11::string::~string(local_a0);
  return in_RDI;
}

Assistant:

std::string Comm::BroadcastFile(const std::string &fileName, const std::string hint,
                                const int rankSource) const
{
    int rank = this->Rank();
    std::string fileContents;

    // Read the file on rank 0 and broadcast it to everybody else
    if (rank == rankSource)
    {
        // load file contents
        fileContents = FileToString(fileName, hint);
    }
    fileContents = this->BroadcastValue(fileContents, rankSource);

    return fileContents;
}